

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fe_sigproc.c
# Opt level: O1

void fe_write_frame(fe_t *fe,mfcc_t *feat,int32 store_pcm)

{
  double *pdVar1;
  byte bVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  double *pdVar6;
  frame_t *pfVar7;
  frame_t *pfVar8;
  powspec_t *ppVar9;
  melfb_t *pmVar10;
  powspec_t *ppVar11;
  int16 *piVar12;
  int16 *piVar13;
  int16 *piVar14;
  mfcc_t *pmVar15;
  mfcc_t *pmVar16;
  uint uVar17;
  powspec_t *spec;
  byte bVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  double *pdVar22;
  long lVar23;
  double *pdVar24;
  uint uVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  int32 is_speech;
  int32 local_6c;
  mfcc_t *local_68;
  fe_t *local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  ulong local_38;
  
  pdVar6 = (double *)fe->frame;
  bVar2 = fe->fft_order;
  sVar3 = fe->fft_size;
  uVar21 = (uint)sVar3;
  local_58 = (ulong)uVar21;
  uVar30 = (ulong)(int)uVar21;
  if (1 < (int)uVar21) {
    uVar19 = 0;
    iVar20 = 0;
    do {
      lVar23 = (long)iVar20;
      uVar25 = uVar21;
      if ((long)uVar19 < lVar23) {
        dVar31 = pdVar6[lVar23];
        pdVar6[lVar23] = pdVar6[uVar19];
        pdVar6[uVar19] = dVar31;
      }
      do {
        iVar27 = iVar20;
        uVar25 = (int)uVar25 / 2;
        iVar20 = iVar27 - uVar25;
      } while ((int)uVar25 <= iVar27);
      iVar20 = iVar27 + uVar25;
      uVar19 = uVar19 + 1;
    } while (uVar19 != uVar21 - 1);
  }
  if (0 < sVar3) {
    uVar19 = 0;
    do {
      dVar31 = pdVar6[uVar19];
      pdVar6[uVar19] = dVar31 + pdVar6[uVar19 + 1];
      pdVar6[uVar19 + 1] = dVar31 - pdVar6[uVar19 + 1];
      uVar19 = uVar19 + 2;
    } while (uVar19 < uVar30);
  }
  if (1 < bVar2) {
    uVar25 = 1;
    do {
      uVar17 = uVar25 + 1;
      if (0 < sVar3) {
        bVar18 = (byte)uVar25;
        iVar20 = 1 << (bVar18 & 0x1f);
        uVar26 = 1 << (bVar18 - 1 & 0x1f);
        uVar25 = 2 << (bVar18 & 0x1f);
        local_38 = (ulong)uVar25;
        local_40 = (long)(int)uVar25;
        local_48 = (long)iVar20;
        local_50 = local_40 * 8;
        pdVar24 = pdVar6 + local_48;
        lVar29 = (ulong)(iVar20 * 2 - 2) + 1;
        lVar23 = 0;
        pdVar22 = pdVar6;
        do {
          dVar31 = pdVar6[lVar23];
          pdVar1 = pdVar6 + local_48 + lVar23;
          dVar32 = *pdVar1;
          pdVar6[lVar23] = dVar31 + dVar32;
          *pdVar1 = dVar31 - dVar32;
          pdVar1[(int)uVar26] = -pdVar1[(int)uVar26];
          if (1 < (int)uVar26) {
            pfVar7 = fe->ccc;
            pfVar8 = fe->sss;
            uVar19 = 1;
            lVar28 = 0;
            do {
              iVar27 = (int)uVar19 << (bVar2 - (char)uVar17 & 0x1f);
              iVar20 = (int)lVar29 + (int)lVar28;
              dVar33 = pdVar24[uVar19] * (double)pfVar7[iVar27] +
                       (double)pfVar8[iVar27] * pdVar6[iVar20];
              dVar32 = pdVar24[uVar19] * (double)pfVar8[iVar27] -
                       (double)pfVar7[iVar27] * pdVar6[iVar20];
              dVar31 = pdVar24[lVar28 + -1];
              pdVar6[iVar20] = dVar31 - dVar32;
              pdVar24[uVar19] = -dVar31 - dVar32;
              pdVar24[lVar28 + -1] = pdVar22[uVar19] - dVar33;
              pdVar22[uVar19] = dVar33 + pdVar22[uVar19];
              uVar19 = uVar19 + 1;
              lVar28 = lVar28 + -1;
            } while (uVar26 != uVar19);
          }
          lVar23 = lVar23 + local_40;
          pdVar22 = pdVar22 + local_40;
          pdVar24 = pdVar24 + local_40;
          lVar29 = lVar29 + local_38;
        } while (lVar23 < (long)uVar30);
      }
      uVar25 = uVar17;
    } while (bVar2 != uVar17);
  }
  ppVar9 = fe->spec;
  *ppVar9 = (powspec_t)(*pdVar6 * *pdVar6);
  if (1 < sVar3) {
    uVar19 = 1;
    if (1 < uVar21 >> 1) {
      uVar19 = (ulong)(uVar21 >> 1);
    }
    pdVar24 = pdVar6 + uVar30;
    uVar30 = 0;
    do {
      pdVar24 = pdVar24 + -1;
      ppVar9[uVar30 + 1] =
           (powspec_t)(pdVar6[uVar30 + 1] * pdVar6[uVar30 + 1] + *pdVar24 * *pdVar24);
      uVar30 = uVar30 + 1;
    } while (uVar19 != uVar30);
  }
  pmVar10 = fe->mel_fb;
  iVar20 = pmVar10->num_filters;
  if (0 < (long)iVar20) {
    ppVar11 = fe->mfspec;
    piVar12 = pmVar10->spec_start;
    piVar13 = pmVar10->filt_start;
    piVar14 = pmVar10->filt_width;
    lVar23 = 0;
    do {
      sVar3 = piVar12[lVar23];
      sVar4 = piVar13[lVar23];
      ppVar11[lVar23] = 0.0;
      sVar5 = piVar14[lVar23];
      if (0 < (long)sVar5) {
        pmVar15 = pmVar10->filt_coeffs;
        dVar31 = 0.0;
        lVar29 = 0;
        do {
          dVar31 = dVar31 + (double)(float)pmVar15[sVar4 + lVar29] * (double)ppVar9[sVar3 + lVar29];
          ppVar11[lVar23] = (powspec_t)dVar31;
          lVar29 = lVar29 + 1;
        } while (sVar5 != lVar29);
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 != iVar20);
  }
  local_68 = feat;
  local_60 = fe;
  fe_track_snr(fe,&local_6c);
  ppVar9 = fe->mfspec;
  if (0 < fe->mel_fb->num_filters) {
    lVar23 = 0;
    do {
      dVar31 = log((double)ppVar9[lVar23] + 0.0001);
      ppVar9[lVar23] = (powspec_t)dVar31;
      lVar23 = lVar23 + 1;
    } while (lVar23 < fe->mel_fb->num_filters);
  }
  pmVar15 = local_68;
  if (fe->log_spec == '\x02') {
    fe_dct2(fe,ppVar9,local_68,0);
    fe_dct3(fe,pmVar15,ppVar9);
    bVar2 = fe->feature_dimension;
    if ((ulong)bVar2 != 0) {
      uVar30 = 0;
      do {
        pmVar15[uVar30] = (mfcc_t)(float)(double)ppVar9[uVar30];
        uVar30 = uVar30 + 1;
      } while (bVar2 != uVar30);
    }
  }
  else if (fe->log_spec == '\x01') {
    bVar2 = fe->feature_dimension;
    if ((ulong)bVar2 != 0) {
      uVar30 = 0;
      do {
        local_68[uVar30] = (mfcc_t)(float)(double)ppVar9[uVar30];
        uVar30 = uVar30 + 1;
      } while (bVar2 != uVar30);
    }
  }
  else {
    if (fe->transform == '\x02') {
      iVar20 = 1;
    }
    else {
      if (fe->transform != '\x01') {
        fe_spec2cep(fe,ppVar9,local_68);
        goto LAB_00136832;
      }
      iVar20 = 0;
    }
    fe_dct2(fe,ppVar9,local_68,iVar20);
  }
LAB_00136832:
  if ((fe->mel_fb->lifter_val != 0) && (bVar2 = fe->num_cepstra, (ulong)bVar2 != 0)) {
    pmVar16 = fe->mel_fb->lifter;
    uVar30 = 0;
    do {
      pmVar15[uVar30] = (mfcc_t)((float)pmVar15[uVar30] * (float)pmVar16[uVar30]);
      uVar30 = uVar30 + 1;
    } while (bVar2 != uVar30);
  }
  fe_vad_hangover(fe,pmVar15,local_6c,store_pcm);
  return;
}

Assistant:

void
fe_write_frame(fe_t * fe, mfcc_t * feat, int32 store_pcm)
{
    int32 is_speech;

    fe_spec_magnitude(fe);
    fe_mel_spec(fe);
    fe_track_snr(fe, &is_speech);
    fe_mel_cep(fe, feat);
    fe_lifter(fe, feat);
    fe_vad_hangover(fe, feat, is_speech, store_pcm);
}